

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

Arg * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::parse_arg_index
          (Arg *__return_storage_ptr__,BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,Char **s
          )

{
  uint arg_index;
  FormatError *this_00;
  CStringRef message;
  char *error;
  char *local_20;
  
  local_20 = (char *)0x0;
  if ((byte)(**s - 0x3aU) < 0xf6) {
    arg_index = (this->super_FormatterBase).next_arg_index_;
    if ((int)arg_index < 0) {
      local_20 = "cannot switch from manual to automatic argument indexing";
LAB_0013f132:
      *(undefined8 *)&__return_storage_ptr__->type = 0;
      *(undefined8 *)&__return_storage_ptr__->field_0x18 = 0;
      (__return_storage_ptr__->super_Value).field_0.long_long_value = 0;
      (__return_storage_ptr__->super_Value).field_0.string.size = 0;
      goto LAB_0013f152;
    }
    (this->super_FormatterBase).next_arg_index_ = arg_index + 1;
  }
  else {
    arg_index = internal::parse_nonnegative_int<char>(s);
    if (0 < (this->super_FormatterBase).next_arg_index_) {
      local_20 = "cannot switch from automatic to manual argument indexing";
      goto LAB_0013f132;
    }
    (this->super_FormatterBase).next_arg_index_ = -1;
  }
  internal::FormatterBase::do_get_arg
            (__return_storage_ptr__,&this->super_FormatterBase,arg_index,&local_20);
LAB_0013f152:
  if (local_20 == (char *)0x0) {
    return __return_storage_ptr__;
  }
  this_00 = (FormatError *)__cxa_allocate_exception(0x10);
  message.data_ = local_20;
  if ((**s != '}') && (**s != ':')) {
    message.data_ = "invalid format string";
  }
  FormatError::FormatError(this_00,message);
  __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

inline internal::Arg BasicFormatter<Char, AF>::parse_arg_index(const Char *&s) {
  const char *error = 0;
  internal::Arg arg = *s < '0' || *s > '9' ?
        next_arg(error) : get_arg(internal::parse_nonnegative_int(s), error);
  if (error) {
    FMT_THROW(FormatError(
                *s != '}' && *s != ':' ? "invalid format string" : error));
  }
  return arg;
}